

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnFuncType
          (SharedValidator *this,Location *loc,Index param_count,Type *param_types,
          Index result_count,Type *result_types,Index type_index)

{
  Result RVar1;
  Enum EVar2;
  Index local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  FuncType local_68;
  
  EVar2 = Ok;
  if ((1 < result_count) && ((this->options_).features.multi_value_enabled_ == false)) {
    RVar1 = PrintError(this,loc,
                       "multiple result values are not supported without multi-value enabled.");
    EVar2 = (Enum)(RVar1.enum_ == Error);
  }
  local_ac = this->num_types_;
  this->num_types_ = local_ac + 1;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_88,param_types,
             param_types + param_count);
  local_a8 = 0;
  uStack_a0 = 0;
  local_98 = 0;
  std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_range_initialize<wabt::Type_const*>
            ((vector<wabt::Type,std::allocator<wabt::Type>> *)&local_a8,result_types,
             result_types + result_count);
  FuncType::FuncType(&local_68,(TypeVector *)&local_88,(TypeVector *)&local_a8,type_index);
  std::
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,wabt::SharedValidator::FuncType>,std::_Select1st<std::pair<unsigned_int_const,wabt::SharedValidator::FuncType>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wabt::SharedValidator::FuncType>>>
  ::_M_emplace_unique<unsigned_int,wabt::SharedValidator::FuncType>
            ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,wabt::SharedValidator::FuncType>,std::_Select1st<std::pair<unsigned_int_const,wabt::SharedValidator::FuncType>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,wabt::SharedValidator::FuncType>>>
              *)&this->func_types_,&local_ac,&local_68);
  FuncType::~FuncType(&local_68);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_a8);
  std::_Vector_base<wabt::Type,_std::allocator<wabt::Type>_>::~_Vector_base
            ((_Vector_base<wabt::Type,_std::allocator<wabt::Type>_> *)&local_88);
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::OnFuncType(const Location& loc,
                                   Index param_count,
                                   const Type* param_types,
                                   Index result_count,
                                   const Type* result_types,
                                   Index type_index) {
  Result result = Result::Ok;
  if (!options_.features.multi_value_enabled() && result_count > 1) {
    result |= PrintError(loc,
                         "multiple result values are not supported without "
                         "multi-value enabled.");
  }
  func_types_.emplace(
      num_types_++,
      FuncType{ToTypeVector(param_count, param_types),
               ToTypeVector(result_count, result_types), type_index});
  return result;
}